

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
                  *RHS)

{
  U *pUVar1;
  undefined1 *__ptr;
  Unparsed *__last;
  Unparsed *pUVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  Unparsed *__cur;
  ulong uVar6;
  Unparsed *__result;
  undefined8 *puVar7;
  undefined8 *puVar8;
  Unparsed *__first;
  long lVar9;
  ulong uVar10;
  
  if (this == RHS) {
    return this;
  }
  __first = (Unparsed *)
            (RHS->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
  pUVar1 = &(RHS->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
            .FirstEl;
  if (__first != (Unparsed *)pUVar1) {
    __ptr = (undefined1 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
    if ((U *)__ptr !=
        &(this->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
         .FirstEl) {
      free(__ptr);
      __first = (Unparsed *)
                (RHS->
                super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                .super_SmallVectorBase.BeginX;
    }
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.BeginX = __first;
    pvVar4 = (RHS->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
             .super_SmallVectorBase.CapacityX;
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX =
         (RHS->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
         .super_SmallVectorBase.EndX;
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.CapacityX = pvVar4;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.CapacityX = pUVar1;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = pUVar1;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.BeginX = pUVar1;
    return this;
  }
  __last = (Unparsed *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar10 = (long)__last - (long)__first;
  __result = (Unparsed *)
             (this->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
             .super_SmallVectorBase.BeginX;
  pUVar2 = (Unparsed *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  lVar9 = (long)pUVar2 - (long)__result;
  uVar6 = lVar9 / 0x18;
  if ((ulong)((long)uVar10 / 0x18) <= uVar6) {
    if (__last != __first) {
      __result = std::__copy_move<true,false,std::random_access_iterator_tag>::
                 __copy_m<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>::Unparsed*,Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>::Unparsed*>
                           (__first,__last,__result);
      __first = (Unparsed *)
                (RHS->
                super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                .super_SmallVectorBase.BeginX;
    }
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = __result;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = __first;
    return this;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                    .super_SmallVectorBase.CapacityX - (long)__result) < uVar10) {
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = __result;
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
           ,(long)uVar10 / 0x18);
  }
  else if (pUVar2 != __result) {
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>::Unparsed*,Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>::Unparsed*>
              (__first,(Unparsed *)(lVar9 + (long)__first),__result);
    goto LAB_00a8e777;
  }
  uVar6 = 0;
LAB_00a8e777:
  puVar3 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  puVar7 = (undefined8 *)
           (uVar6 * 0x18 +
           (long)(this->
                 super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                 ).
                 super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                 .super_SmallVectorBase.BeginX);
  for (puVar8 = (undefined8 *)
                ((long)(RHS->
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                       .super_SmallVectorBase.BeginX + uVar6 * 0x18); puVar8 != puVar3;
      puVar8 = puVar8 + 3) {
    puVar7[2] = puVar8[2];
    uVar5 = puVar8[1];
    *puVar7 = *puVar8;
    puVar7[1] = uVar5;
    puVar7 = puVar7 + 3;
  }
  (this->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)(uVar10 + (long)(this->
                               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
                               .super_SmallVectorBase.BeginX);
  (RHS->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (RHS->
       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
       .super_SmallVectorBase.BeginX;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}